

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

timestamp_t __thiscall
duckdb::WindowQuantileState<duckdb::timestamp_t>::WindowScalar<duckdb::timestamp_t,false>
          (WindowQuantileState<duckdb::timestamp_t> *this,CursorType *data,SubFrames *frames,idx_t n
          ,Vector *result,QuantileValue *q)

{
  long lVar1;
  vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_true> *dest_00;
  size_t sVar2;
  pointer this_00;
  timestamp_t tVar3;
  pointer pHVar4;
  reference pvVar5;
  InternalException *this_01;
  double dVar6;
  undefined1 auVar7 [16];
  Interpolator<false> interp;
  array<duckdb::timestamp_t,_2UL> dest;
  undefined1 local_88 [32];
  idx_t local_68;
  size_t local_60;
  double local_58;
  double dStack_50;
  timestamp_t local_40;
  int64_t local_38;
  
  if ((QuantileSortTree *)
      (this->qst).
      super_unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
      .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false> != (QuantileSortTree *)0x0) {
    this_00 = unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
              ::operator->(&this->qst);
    tVar3 = QuantileSortTree::WindowScalar<duckdb::timestamp_t,duckdb::timestamp_t,false>
                      (this_00,data,frames,n,result,q);
    return (timestamp_t)tVar3.value;
  }
  if ((this->s).
      super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>_>
      .
      super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_*,_false>
      ._M_head_impl !=
      (HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
       *)0x0) {
    pHVar4 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>,_true>
             ::operator->(&this->s);
    sVar2 = pHVar4->_count;
    local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
    lVar1 = sVar2 - 1;
    auVar7._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar7._0_8_ = lVar1;
    auVar7._12_4_ = 0x45300000;
    dStack_50 = auVar7._8_8_ - 1.9342813113834067e+25;
    local_88._8_8_ =
         (dStack_50 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * q->dbl;
    local_58 = (double)local_88._8_8_;
    dVar6 = floor((double)local_88._8_8_);
    local_88._16_8_ = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
    dVar6 = ceil(local_58);
    local_88._24_8_ = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
    local_68 = 0;
    local_60 = sVar2;
    pHVar4 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>,_true>
             ::operator->(&this->s);
    dest_00 = &this->skips;
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
    ::at(pHVar4,local_88._16_8_,(local_88._24_8_ - local_88._16_8_) + 1,
         &dest_00->
          super_vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_std::allocator<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
        );
    pvVar5 = vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_true>::operator[](dest_00,0);
    local_40.value = (pvVar5->second).value;
    pvVar5 = vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_true>::operator[]
                       (dest_00,(ulong)(0x10 < (ulong)((long)(this->skips).
                                                                                                                          
                                                  super_vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_std::allocator<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
                                                  .
                                                  super__Vector_base<std::pair<unsigned_long,_duckdb::timestamp_t>,_std::allocator<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->skips).
                                                                                                                
                                                  super_vector<std::pair<unsigned_long,_duckdb::timestamp_t>,_std::allocator<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
                                                  .
                                                  super__Vector_base<std::pair<unsigned_long,_duckdb::timestamp_t>,_std::allocator<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
    local_38 = (pvVar5->second).value;
    tVar3 = Interpolator<false>::Extract<duckdb::timestamp_t,duckdb::timestamp_t>
                      ((Interpolator<false> *)local_88,&local_40,result);
    return (timestamp_t)tVar3.value;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_88._0_8_ = local_88 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"No accelerator for scalar QUANTILE","");
  InternalException::InternalException(this_01,(string *)local_88);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}